

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim2.c
# Opt level: O2

Gia_Sim2_t * Gia_Sim2Create(Gia_Man_t *pAig,Gia_ParSim_t *pPars)

{
  int iVar1;
  int iVar2;
  Gia_Sim2_t *p;
  uint *puVar3;
  Vec_Int_t *pVVar4;
  Gia_Obj_t *pGVar5;
  uint v;
  int level;
  size_t __size;
  
  p = (Gia_Sim2_t *)calloc(1,0x30);
  p->pAig = pAig;
  p->pPars = pPars;
  iVar1 = pPars->nWords;
  p->nWords = iVar1;
  iVar2 = pAig->nObjs;
  __size = (long)(iVar2 * iVar1) << 2;
  puVar3 = (uint *)malloc(__size);
  p->pDataSim = puVar3;
  level = (int)__size;
  if (puVar3 == (uint *)0x0) {
    Abc_Print(level,"Simulator could not allocate %.2f GB for simulation info.\n",
              (double)iVar2 * (double)iVar1 * 4.0 * 9.313225746154785e-10);
    Gia_Sim2Delete(p);
    p = (Gia_Sim2_t *)0x0;
  }
  else {
    pVVar4 = Vec_IntAlloc(level);
    p->vClassOld = pVVar4;
    pVVar4 = Vec_IntAlloc(level);
    p->vClassNew = pVVar4;
    if (pPars->fVerbose != 0) {
      Abc_Print(level,"Memory: AIG = %7.2f MB.  SimInfo = %7.2f MB.\n",
                (double)pAig->nObjs * 12.0 * 9.5367431640625e-07,
                (double)iVar1 * 4.0 * (double)pAig->nObjs * 9.5367431640625e-07);
    }
    Gia_ManSetPhase(pAig);
    for (v = 0; (int)v < pAig->nObjs; v = v + 1) {
      pGVar5 = Gia_ManObj(pAig,v);
      if (pGVar5 == (Gia_Obj_t *)0x0) {
        return p;
      }
      pGVar5->Value = v;
    }
  }
  return p;
}

Assistant:

Gia_Sim2_t * Gia_Sim2Create( Gia_Man_t * pAig, Gia_ParSim_t * pPars )
{
    Gia_Sim2_t * p;
    Gia_Obj_t * pObj;
    int i;
    p = ABC_CALLOC( Gia_Sim2_t, 1 );
    p->pAig      = pAig;
    p->pPars     = pPars;
    p->nWords    = pPars->nWords;
    p->pDataSim  = ABC_ALLOC( unsigned, p->nWords * Gia_ManObjNum(p->pAig) );
    if ( !p->pDataSim  )
    { 
        Abc_Print( 1, "Simulator could not allocate %.2f GB for simulation info.\n", 
            4.0 * p->nWords * Gia_ManObjNum(p->pAig) / (1<<30) );
        Gia_Sim2Delete( p );
        return NULL;
    }
    p->vClassOld = Vec_IntAlloc( 100 );
    p->vClassNew = Vec_IntAlloc( 100 );
    if ( pPars->fVerbose )
        Abc_Print( 1, "Memory: AIG = %7.2f MB.  SimInfo = %7.2f MB.\n", 
            12.0*Gia_ManObjNum(p->pAig)/(1<<20), 4.0*p->nWords*Gia_ManObjNum(p->pAig)/(1<<20) );
    // prepare AIG
    Gia_ManSetPhase( pAig );
    Gia_ManForEachObj( pAig, pObj, i )
        pObj->Value = i;
    return p;
}